

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::skip_alternatives(depth_first_traverser *this)

{
  pointer pcVar1;
  child_t<clipp::parameter,_clipp::group> *pcVar2;
  iterator __begin2;
  pointer pcVar3;
  
  pcVar3 = (this->stack_).
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->stack_).
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar3 != pcVar1) {
    for (; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
      if (((pcVar3->parent != (group *)0x0) && (pcVar3->parent->exclusive_ == true)) &&
         (pcVar2 = (pcVar3->cur)._M_current, pcVar2 < (pcVar3->end)._M_current)) {
        (pcVar3->end)._M_current = pcVar2 + 1;
      }
    }
  }
  return this;
}

Assistant:

depth_first_traverser&
        skip_alternatives() {
            if(stack_.empty()) return *this;

            //exclude all other alternatives in surrounding groups
            //by making their current position the last one
            for(auto& c : stack_) {
                if(c.parent && c.parent->exclusive() && c.cur < c.end)
                    c.end = c.cur+1;
            }

            return *this;
        }